

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O3

void __thiscall intel_acm_t::_read(intel_acm_t *this)

{
  header_t *phVar1;
  header_t *this_00;
  string local_30;
  
  this_00 = (header_t *)operator_new(0xf0);
  header_t::header_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
  phVar1 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
           .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl;
  (this->m_header)._M_t.
  super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>._M_t.
  super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>.
  super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl = this_00;
  if (phVar1 != (header_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
    this_00 = (this->m_header)._M_t.
              super___uniq_ptr_impl<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>
              ._M_t.
              super__Tuple_impl<0UL,_intel_acm_t::header_t_*,_std::default_delete<intel_acm_t::header_t>_>
              .super__Head_base<0UL,_intel_acm_t::header_t_*,_false>._M_head_impl;
  }
  kaitai::kstream::read_bytes_abi_cxx11_
            (&local_30,(this->super_kstruct).m__io,
             (ulong)((this_00->m_module_size -
                     (this_00->m_header_size + this_00->m_scratch_space_size)) * 4));
  std::__cxx11::string::operator=((string *)&this->m_body,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void intel_acm_t::_read() {
    m_header = std::unique_ptr<header_t>(new header_t(m__io, this, m__root));
    m_body = m__io->read_bytes((4 * ((header()->module_size() - header()->header_size()) - header()->scratch_space_size())));
}